

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

void __thiscall
IRBuilderAsmJs::BuildInt1Uint16x8_1Int1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot)

{
  code *pcVar1;
  bool bVar2;
  ValueType VVar3;
  OpCode opcode;
  RegOpnd *this_00;
  RegOpnd *this_01;
  RegOpnd *this_02;
  undefined4 *puVar4;
  Instr *instr;
  
  this_00 = BuildSrcOpnd(this,src1RegSlot,TySimd128U8);
  IR::Opnd::SetValueType(&this_00->super_Opnd,(ValueType)0x4000);
  this_01 = BuildSrcOpnd(this,src2RegSlot,TyInt32);
  VVar3 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_01->super_Opnd,VVar3);
  this_02 = BuildDstOpnd(this,dstRegSlot,TyInt32);
  VVar3 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_02->super_Opnd,VVar3);
  opcode = GetSimdOpcode(this,newOpcode);
  if (opcode != Simd128_ExtractLane_U8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x15fd,"((opcode == Js::OpCode::Simd128_ExtractLane_U8))",
                       "Unexpected opcode for this format.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  instr = IR::Instr::New(opcode,&this_02->super_Opnd,&this_00->super_Opnd,&this_01->super_Opnd,
                         this->m_func);
  AddInstr(this,instr,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildInt1Uint16x8_1Int1(Js::OpCodeAsmJs newOpcode, uint32 offset, BUILD_SIMD_ARGS_REG3)
{
    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TySimd128U8);
    src1Opnd->SetValueType(ValueType::Simd);

    IR::RegOpnd * src2Opnd = BuildSrcOpnd(src2RegSlot, TyInt32);
    src2Opnd->SetValueType(ValueType::GetInt(false));

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
    dstOpnd->SetValueType(ValueType::GetInt(false));

    Js::OpCode opcode = GetSimdOpcode(newOpcode);

    AssertMsg((opcode == Js::OpCode::Simd128_ExtractLane_U8), "Unexpected opcode for this format.");

    IR::Instr * instr = IR::Instr::New(opcode, dstOpnd, src1Opnd, src2Opnd, m_func);
    AddInstr(instr, offset);
}